

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fprintf_param_float_array(NetOptimize *this,int id,Mat *m,FILE *pp)

{
  uint uVar1;
  float *pfVar2;
  FILE *in_RCX;
  Mat *in_RDX;
  int in_ESI;
  int i;
  float *ptr;
  int count;
  int local_34;
  
  uVar1 = in_RDX->w;
  pfVar2 = ncnn::Mat::operator_cast_to_float_(in_RDX);
  fprintf(in_RCX," -%d=%d",(ulong)(in_ESI + 0x5b04),(ulong)uVar1);
  for (local_34 = 0; local_34 < (int)uVar1; local_34 = local_34 + 1) {
    fprintf(in_RCX,",%e",(double)pfVar2[local_34]);
  }
  return 0;
}

Assistant:

int NetOptimize::fprintf_param_float_array(int id, const ncnn::Mat& m, FILE* pp)
{
    const int count = m.w;
    const float* ptr = m;

    fprintf(pp, " -%d=%d", 23300 + id, count);
    for (int i=0; i<count; i++)
    {
        fprintf(pp, ",%e", ptr[i]);
    }

    return 0;
}